

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O1

int Mig_ManSuppSizeOne(Mig_Obj_t *pObj)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  uint iObj;
  int iVar6;
  
  lVar3 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3)));
  if (*(long *)(lVar3 + 0x60) == 0) {
    iVar4 = *(int *)(lVar3 + 8);
    uVar2 = (long)iVar4 + 500;
    iVar6 = (int)uVar2;
    if (*(int *)(lVar3 + 0x58) < iVar6) {
      pvVar5 = malloc(uVar2 * 4);
      *(void **)(lVar3 + 0x60) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *(int *)(lVar3 + 0x58) = iVar6;
    }
    if (-500 < iVar4) {
      memset(*(void **)(lVar3 + 0x60),0,(uVar2 & 0xffffffff) << 2);
    }
    *(int *)(lVar3 + 0x5c) = iVar6;
  }
  piVar1 = (int *)(*(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3))) +
                  0x54);
  *piVar1 = *piVar1 + 1;
  iObj = (uint)pObj->pFans[3] >> 1;
  iVar4 = Mig_ManSuppSize2_rec
                    (*(Mig_Man_t **)((long)pObj + (-0x10 - (ulong)((iObj & 0xfff) << 4))),iObj);
  return iVar4;
}

Assistant:

int Mig_ManSuppSizeOne( Mig_Obj_t * pObj )
{
    Mig_ObjIncrementTravId( pObj );
//    return Mig_ManSuppSize_rec( pObj );
    return Mig_ManSuppSize2_rec( Mig_ObjMan(pObj), Mig_ObjId(pObj) );
}